

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_int,unsigned_int_const&,char_const(&)[14],int>
          (ValidationContext *this,IssueError *issue,uint *args,uint *args_1,uint *args_2,
          char (*args_3) [14],int *args_4)

{
  char *pcVar1;
  string_view fmt;
  format_args args_00;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  ulong local_88 [2];
  ulong local_78;
  ulong local_68;
  char (*local_58) [14];
  ulong local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_d0[0] = (issue->super_Issue).type;
  local_d0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_c8._M_p = (pointer)&local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_88[0] = (ulong)*args;
  local_78 = (ulong)*args_1;
  local_68 = (ulong)*args_2;
  local_48 = (ulong)(uint)*args_4;
  fmt.size_ = 0x1c222;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1._0_4_ = *args_2;
  args_00.desc_ = (unsigned_long_long)local_88;
  args_00.field_1._4_4_ = 0;
  local_58 = args_3;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_p != &local_b8) {
      operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }